

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O3

void __thiscall
duckdb::FirstFunctionStringBase<false,true>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
          (FirstFunctionStringBase<false,true> *this,FirstState<duckdb::string_t> *state,
          AggregateInputData *input_data,string_t value,bool is_null)

{
  undefined4 uVar1;
  data_ptr_t __dest;
  
  if (value.value._8_4_ == 0) {
    *(undefined2 *)(this + 0x10) = 1;
    if ((uint)input_data < 0xd) {
      *(AggregateInputData **)this = input_data;
      __dest = value.value._0_8_;
    }
    else {
      __dest = ArenaAllocator::Allocate
                         ((ArenaAllocator *)(state->value).value.pointer.ptr,
                          (ulong)input_data & 0xffffffff);
      switchD_015de399::default(__dest,value.value._0_8_,(ulong)input_data & 0xffffffff);
      uVar1 = *(undefined4 *)__dest;
      *(uint *)this = (uint)input_data;
      *(undefined4 *)(this + 4) = uVar1;
    }
    *(data_ptr_t *)(this + 8) = __dest;
  }
  return;
}

Assistant:

static void SetValue(STATE &state, AggregateInputData &input_data, string_t value, bool is_null) {
		if (LAST && state.is_set) {
			Destroy(state, input_data);
		}
		if (is_null) {
			if (!SKIP_NULLS) {
				state.is_set = true;
				state.is_null = true;
			}
		} else {
			state.is_set = true;
			state.is_null = false;
			if ((COMBINE && !LAST) || value.IsInlined()) {
				// We use the aggregate allocator for 'first', so the allocation is already done when combining
				// Of course, if the value is inlined, we also don't need to allocate
				state.value = value;
			} else {
				// non-inlined string, need to allocate space for it
				auto len = value.GetSize();
				auto ptr = LAST ? new char[len] : char_ptr_cast(input_data.allocator.Allocate(len));
				memcpy(ptr, value.GetData(), len);

				state.value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
			}
		}
	}